

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

int color(char type,CHAR_DATA *ch,char *string)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  char code [20];
  
  bVar2 = is_npc(ch);
  if ((bVar2) && ((ch->act[0] & 8) == 0)) {
    return 0;
  }
  iVar4 = (int)type;
  switch(iVar4) {
  case 0x6d:
    code[0] = '\x1b';
    code[1] = '[';
    code[2] = '0';
    code[3] = ';';
    code[4] = '3';
    code[5] = '5';
    code[6] = 'm';
    code[7] = '\0';
    break;
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x78:
  case 0x7a:
switchD_002d8d13_caseD_45:
    code._4_4_ = SUB84(code._0_8_,4) & 0xffffff00;
    builtin_strncpy(code,"\x1b[0m",4);
    break;
  case 0x72:
    code[0] = '\x1b';
    code[1] = '[';
    code[2] = '0';
    code[3] = ';';
    code[4] = '3';
    code[5] = '1';
    code[6] = 'm';
    code[7] = '\0';
    break;
  case 0x77:
    code[0] = '\x1b';
    code[1] = '[';
    code[2] = '0';
    code[3] = ';';
    code[4] = '3';
    code[5] = '7';
    code[6] = 'm';
    code[7] = '\0';
    break;
  case 0x79:
    code[0] = '\x1b';
    code[1] = '[';
    code[2] = '0';
    code[3] = ';';
    code[4] = '3';
    code[5] = '3';
    code[6] = 'm';
    code[7] = '\0';
    break;
  case 0x7b:
    code[0] = '{';
    code[1] = '\0';
    cVar3 = '{';
    goto LAB_002d8dfa;
  case 0x7c:
    code._2_6_ = code._2_6_ & 0xffffffffff00;
    code[0] = '\n';
    code[1] = '\r';
LAB_002d8dd4:
    cVar3 = '\n';
    goto LAB_002d8dfa;
  default:
    switch(iVar4) {
    case 0x42:
      uVar5 = 0x6d34333b305b1b;
      break;
    case 0x43:
      uVar5 = 0x6d36333b305b1b;
      break;
    case 0x44:
      code[0] = '\x1b';
      code[1] = '[';
      code[2] = '1';
      code[3] = ';';
      code[4] = '3';
      code[5] = '0';
      code[6] = 'm';
      code[7] = '\0';
      goto LAB_002d8df8;
    case 0x45:
    case 0x46:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
      goto switchD_002d8d13_caseD_45;
    case 0x47:
      uVar5 = 0x6d32333b305b1b;
      break;
    case 0x4d:
      uVar5 = 0x6d35333b305b1b;
      break;
    default:
      if (iVar4 == 0x2a) {
        code[0] = '\a';
        code[1] = '\0';
        cVar3 = '\a';
        goto LAB_002d8dfa;
      }
      if (iVar4 == 0x2f) {
        code[0] = '\n';
        code[1] = '\0';
        goto LAB_002d8dd4;
      }
      if (iVar4 == 0x52) {
        uVar5 = 0x6d31333b305b1b;
      }
      else if (iVar4 == 0x57) {
        uVar5 = 0x6d37333b305b1b;
      }
      else {
        if (iVar4 != 0x59) {
          if (iVar4 == 0x62) {
            code[0] = '\x1b';
            code[1] = '[';
            code[2] = '0';
            code[3] = ';';
            code[4] = '3';
            code[5] = '4';
            code[6] = 'm';
            code[7] = '\0';
          }
          else if (iVar4 == 99) {
            code[0] = '\x1b';
            code[1] = '[';
            code[2] = '0';
            code[3] = ';';
            code[4] = '3';
            code[5] = '6';
            code[6] = 'm';
            code[7] = '\0';
          }
          else {
            if (iVar4 != 0x67) goto switchD_002d8d13_caseD_45;
            code[0] = '\x1b';
            code[1] = '[';
            code[2] = '0';
            code[3] = ';';
            code[4] = '3';
            code[5] = '2';
            code[6] = 'm';
            code[7] = '\0';
          }
          goto LAB_002d8df8;
        }
        uVar5 = 0x6d33333b305b1b;
      }
    }
    code._0_8_ = uVar5 | 0x10000;
  }
LAB_002d8df8:
  cVar3 = '\x1b';
LAB_002d8dfa:
  lVar7 = 1;
  while (cVar3 != '\0') {
    string[lVar7 + -1] = cVar3;
    string[lVar7] = '\0';
    pcVar1 = code + lVar7;
    lVar7 = lVar7 + 1;
    cVar3 = *pcVar1;
  }
  sVar6 = strlen(code);
  return (int)sVar6;
}

Assistant:

int color(char type, CHAR_DATA *ch, char *string)
{
	char code[20];
	char *p = (char *)'\0';

	if (is_npc(ch) && !IS_SET(ch->act, ACT_WARD_MOB))
		return 0;

	switch (type)
	{
		case 'x':
			sprintf(code, CLEAR);
			break;
		case 'b':
			sprintf(code, C_BLUE);
			break;
		case 'c':
			sprintf(code, C_CYAN);
			break;
		case 'g':
			sprintf(code, C_GREEN);
			break;
		case 'm':
			sprintf(code, C_MAGENTA);
			break;
		case 'r':
			sprintf(code, C_RED);
			break;
		case 'w':
			sprintf(code, C_WHITE);
			break;
		case 'y':
			sprintf(code, C_YELLOW);
			break;
		case 'B':
			sprintf(code, C_B_BLUE);
			break;
		case 'C':
			sprintf(code, C_B_CYAN);
			break;
		case 'G':
			sprintf(code, C_B_GREEN);
			break;
		case 'M':
			sprintf(code, C_B_MAGENTA);
			break;
		case 'R':
			sprintf(code, C_B_RED);
			break;
		case 'W':
			sprintf(code, C_B_WHITE);
			break;
		case 'Y':
			sprintf(code, C_B_YELLOW);
			break;
		case 'D':
			sprintf(code, C_D_GREY);
			break;
		case '*':
			sprintf(code, "%c", 007);
			break;
		case '/':
			sprintf(code, "%c", 012);
			break;
		case '{':
			sprintf(code, "%c", '{');
			break;
		case '|':
			sprintf(code, "\n\r");
			break;
		default:
			sprintf(code, CLEAR);
			break;
	}

	p = code;

	while (*p != '\0')
	{
		*string = *p++;
		*++string = '\0';
	}

	return strlen(code);
}